

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O2

void __thiscall
Time::run(Time *this,unsigned_long_long events,StochasticEventGenerator *eventSource,
         unsigned_long_long maxSteps,ostream *log,bool init)

{
  pointer ppTVar1;
  pointer ppEVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_long_long e;
  ulong uVar8;
  ulong uVar9;
  string local_50 [32];
  
  poVar5 = std::operator<<(log,"\rstarting simulation: ");
  poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
  poVar5 = std::operator<<(poVar5," events from ");
  std::__cxx11::string::string
            (local_50,(string *)
                      &(eventSource->super_StochasticVariable).super_StochasticProcess.
                       super_Parametric.parametricName);
  poVar5 = std::operator<<(poVar5,local_50);
  poVar5 = std::operator<<(poVar5,".         \t");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string(local_50);
  if (init) {
    uVar4 = 0;
    while( true ) {
      ppTVar1 = (this->timeObjects).
                super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->timeObjects).
                        super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <=
          (ulong)uVar4) break;
      (*ppTVar1[uVar4]->_vptr_TimeDependent[4])();
      uVar4 = uVar4 + 1;
    }
    uVar4 = 0;
    while( true ) {
      ppEVar2 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->timeEstimators).
                        super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) <= (ulong)uVar4)
      break;
      (*(ppEVar2[uVar4]->super_Parametric)._vptr_Parametric[4])();
      uVar4 = uVar4 + 1;
    }
  }
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  while( true ) {
    if (events <= uVar8) {
      return;
    }
    if (maxSteps <= uVar9) break;
    bVar3 = step(this);
    if (!bVar3) {
      poVar5 = std::operator<<(log,
                               "\rerror running simulation: some circular dependencies couldn\'t be resolved"
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
      return;
    }
    uVar6 = (ulong)((long)(this->timeEstimators).
                          super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->timeEstimators).
                         super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
    while( true ) {
      uVar4 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar4;
      if (uVar4 == 0xffffffff) break;
      (*((this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
         _M_impl.super__Vector_impl_data._M_start[(int)uVar4]->super_Parametric)._vptr_Parametric[5]
      )();
    }
    uVar6 = (ulong)((long)(this->timeObjects).
                          super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->timeObjects).
                         super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    while( true ) {
      uVar4 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar4;
      if (uVar4 == 0xffffffff) break;
      (*(this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>.
        _M_impl.super__Vector_impl_data._M_start[(int)uVar4]->_vptr_TimeDependent[2])();
    }
    uVar4 = (*(eventSource->super_StochasticVariable).super_StochasticProcess.super_Parametric.
              _vptr_Parametric[0xf])();
    uVar8 = uVar8 + (uVar4 & 0xff);
    uVar6 = (uVar8 * 100) / events;
    if (uVar6 != uVar7) {
      poVar5 = std::operator<<(log,"\rrunning simulation: ");
      poVar5 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar5);
      std::operator<<(poVar5,"%         \t");
      std::ostream::flush();
      uVar7 = uVar6;
    }
    uVar9 = uVar9 + 1;
    if ((char)uVar4 != '\0') {
      uVar9 = 1;
    }
  }
  return;
}

Assistant:

void Time::run(unsigned long long events, StochasticEventGenerator *eventSource, unsigned long long maxSteps, ostream &log, bool init)
{
	// starting note
	log << "\rstarting simulation: " 
			<< events << " events from "
			<< eventSource->getName()
			<< ".         \t"
			<< endl;
	
	// initialise time objects
	if (init) {
		for (uint i=0; i<timeObjects.size(); ++i)
			timeObjects[i]->init();
		for (uint i=0; i<timeEstimators.size(); ++i)
			timeEstimators[i]->init();
	}
	
	unsigned long long lastPercentage = 0;
	for (unsigned long long e=0, s=0; e<events && s<maxSteps; ++s) {

		// perform time step, throw error if unsuccessful
		if (!step()) {
			log << "\rerror running simulation: some circular dependencies couldn't be resolved" << endl;
			return;
		}
		
		// collect values in all estimators
		for (int i=timeEstimators.size()-1; i+1; --i)
			timeEstimators[i]->collect();

		// advance all objects in time
		for (int i=timeObjects.size()-1; i+1; --i)
			timeObjects[i]->proceedToNextState();

		// count events
		if (eventSource->hasEvent()) {
			++e;
			s = 0;
		}
		
		// note to user
		unsigned long long currentPercentage = ( e * 100ULL ) / events;
		if (currentPercentage != lastPercentage) {
			log << "\rrunning simulation: " 
					<< currentPercentage
					<< "%         \t"
					<< flush;
			lastPercentage = currentPercentage;
		}
	}
}